

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjExporter.cpp
# Opt level: O0

string * __thiscall
Assimp::ObjExporter::GetMaterialName_abi_cxx11_
          (string *__return_storage_ptr__,ObjExporter *this,uint index)

{
  int iVar1;
  aiReturn aVar2;
  allocator<char> local_471;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  char local_449 [8];
  char number [13];
  allocator local_42d;
  undefined1 local_42c [8];
  aiString s;
  aiMaterial *mat;
  uint index_local;
  ObjExporter *this_local;
  
  s.data._1016_8_ = this->pScene->mMaterials[index];
  if ((aiMaterial *)s.data._1016_8_ == (aiMaterial *)0x0) {
    if (GetMaterialName[abi:cxx11](unsigned_int)::EmptyStr_abi_cxx11_ == '\0') {
      iVar1 = __cxa_guard_acquire(&GetMaterialName[abi:cxx11](unsigned_int)::EmptyStr_abi_cxx11_);
      if (iVar1 != 0) {
        std::__cxx11::string::string
                  ((string *)&GetMaterialName[abi:cxx11](unsigned_int)::EmptyStr_abi_cxx11_);
        __cxa_atexit(std::__cxx11::string::~string,
                     &GetMaterialName[abi:cxx11](unsigned_int)::EmptyStr_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&GetMaterialName[abi:cxx11](unsigned_int)::EmptyStr_abi_cxx11_);
      }
    }
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)&GetMaterialName[abi:cxx11](unsigned_int)::EmptyStr_abi_cxx11_);
  }
  else {
    aiString::aiString((aiString *)local_42c);
    aVar2 = aiMaterial::Get((aiMaterial *)s.data._1016_8_,"?mat.name",0,0,(aiString *)local_42c);
    if (aVar2 == aiReturn_SUCCESS) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,local_42c + 4,(ulong)(uint)local_42c._0_4_,
                 &local_42d);
      std::allocator<char>::~allocator((allocator<char> *)&local_42d);
    }
    else {
      ASSIMP_itoa10<13ul>((char (*) [13])local_449,index);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_470,local_449,&local_471);
      std::operator+(__return_storage_ptr__,"$Material_",&local_470);
      std::__cxx11::string::~string((string *)&local_470);
      std::allocator<char>::~allocator(&local_471);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ObjExporter::GetMaterialName(unsigned int index) {
    const aiMaterial* const mat = pScene->mMaterials[index];
    if ( nullptr == mat ) {
        static const std::string EmptyStr;
        return EmptyStr;
    }

    aiString s;
    if(AI_SUCCESS == mat->Get(AI_MATKEY_NAME,s)) {
        return std::string(s.data,s.length);
    }

    char number[ sizeof(unsigned int) * 3 + 1 ];
    ASSIMP_itoa10(number,index);
    return "$Material_" + std::string(number);
}